

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal-utils.h
# Opt level: O0

Expression * wasm::LiteralUtils::makeZero(Type type,Module *wasm)

{
  bool bVar1;
  Const *value;
  Literals local_70;
  BasicType local_34;
  Builder local_30;
  Builder builder;
  Module *wasm_local;
  Type type_local;
  
  builder.wasm = (Module *)type.id;
  wasm_local = (Module *)type.id;
  bVar1 = canMakeZero(type);
  if (!bVar1) {
    __assert_fail("canMakeZero(type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/literal-utils.h"
                  ,0x23,"Expression *wasm::LiteralUtils::makeZero(Type, Module &)");
  }
  Builder::Builder(&local_30,wasm);
  local_34 = v128;
  bVar1 = wasm::Type::operator==((Type *)&wasm_local,&local_34);
  if (bVar1) {
    value = Builder::makeConst<int>(&local_30,0);
    type_local.id = (uintptr_t)Builder::makeUnary(&local_30,SplatVecI32x4,(Expression *)value);
  }
  else {
    wasm::Literal::makeZeros(&local_70,(Type)wasm_local);
    type_local.id = (uintptr_t)Builder::makeConstantExpression(&local_30,&local_70);
    Literals::~Literals(&local_70);
  }
  return (Expression *)type_local.id;
}

Assistant:

inline Expression* makeZero(Type type, Module& wasm) {
  assert(canMakeZero(type));
  // TODO: Remove this function once V8 supports v128.const
  // (https://bugs.chromium.org/p/v8/issues/detail?id=8460)
  Builder builder(wasm);
  if (type == Type::v128) {
    return builder.makeUnary(SplatVecI32x4, builder.makeConst(int32_t(0)));
  }
  return builder.makeConstantExpression(Literal::makeZeros(type));
}